

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_write_tag_content
              (yaml_emitter_t *emitter,yaml_char_t *value,size_t length,int need_whitespace)

{
  yaml_char_t *pyVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  byte *pbVar7;
  
  if ((need_whitespace != 0) && (emitter->whitespace == 0)) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
      return 0;
    }
    pyVar1 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar1 + 1;
    *pyVar1 = ' ';
    emitter->column = emitter->column + 1;
  }
  if (length != 0) {
    pbVar7 = value + length;
    do {
      bVar3 = *value;
      if (((((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) ||
          ((bVar3 - 0x24 < 0x3c && ((0xa8000001ac00ffdU >> ((ulong)(bVar3 - 0x24) & 0x3f) & 1) != 0)
           ))) || (bVar3 == 0x7e)) {
        if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
           (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
          return 0;
        }
        bVar3 = *value;
        if ((char)bVar3 < '\0') {
          if ((bVar3 & 0xe0) == 0xc0) {
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = value[1];
            value = value + 2;
            goto LAB_00107992;
          }
          if ((bVar3 & 0xf0) == 0xe0) {
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = value[1];
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = value[2];
            value = value + 3;
            goto LAB_00107992;
          }
          if ((bVar3 & 0xf8) == 0xf0) {
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = value[1];
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = value[2];
            pbVar2 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar2 + 1;
            *pbVar2 = bVar3;
            bVar3 = value[3];
            value = value + 4;
            goto LAB_00107992;
          }
        }
        else {
          value = value + 1;
LAB_00107992:
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
        }
        emitter->column = emitter->column + 1;
      }
      else {
        iVar4 = 1;
        pbVar2 = value;
        if ((((char)bVar3 < '\0') && (iVar4 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (iVar4 = 3, (bVar3 & 0xf0) != 0xe0)) {
          iVar4 = (uint)((bVar3 & 0xf8) == 0xf0) << 2;
        }
        while (value = pbVar2, iVar4 != 0) {
          value = pbVar2 + 1;
          bVar3 = *pbVar2;
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) break;
          pyVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar1 + 1;
          *pyVar1 = '%';
          emitter->column = emitter->column + 1;
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) break;
          cVar6 = '7';
          if (bVar3 < 0xa0) {
            cVar6 = '0';
          }
          pyVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar1 + 1;
          *pyVar1 = cVar6 + (bVar3 >> 4);
          emitter->column = emitter->column + 1;
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar5 = yaml_emitter_flush(emitter), iVar5 == 0)) break;
          iVar4 = iVar4 + -1;
          cVar6 = '7';
          if ((bVar3 & 0xf) < 10) {
            cVar6 = '0';
          }
          pyVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar1 + 1;
          *pyVar1 = cVar6 + (bVar3 & 0xf);
          emitter->column = emitter->column + 1;
          pbVar2 = value;
        }
        if (iVar4 != 0) {
          return 0;
        }
      }
    } while (value != pbVar7);
  }
  emitter->whitespace = 0;
  emitter->indention = 0;
  return 1;
}

Assistant:

static int
yaml_emitter_write_tag_content(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length,
        int need_whitespace)
{
    yaml_string_t string;
    STRING_ASSIGN(string, value, length);

    if (need_whitespace && !emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (IS_ALPHA(string)
                || CHECK(string, ';') || CHECK(string, '/')
                || CHECK(string, '?') || CHECK(string, ':')
                || CHECK(string, '@') || CHECK(string, '&')
                || CHECK(string, '=') || CHECK(string, '+')
                || CHECK(string, '$') || CHECK(string, ',')
                || CHECK(string, '_') || CHECK(string, '.')
                || CHECK(string, '~') || CHECK(string, '*')
                || CHECK(string, '\'') || CHECK(string, '(')
                || CHECK(string, ')') || CHECK(string, '[')
                || CHECK(string, ']')) {
            if (!WRITE(emitter, string)) return 0;
        }
        else {
            int width = WIDTH(string);
            unsigned int value;
            while (width --) {
                value = *(string.pointer++);
                if (!PUT(emitter, '%')) return 0;
                if (!PUT(emitter, (value >> 4)
                            + ((value >> 4) < 10 ? '0' : 'A' - 10)))
                    return 0;
                if (!PUT(emitter, (value & 0x0F)
                            + ((value & 0x0F) < 10 ? '0' : 'A' - 10)))
                    return 0;
            }
        }
    }

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}